

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

Logout * anon_unknown.dwarf_5319c9::createT11Logout
                   (Logout *__return_storage_ptr__,char *sender,char *target,int seq)

{
  int iVar1;
  Logout logout;
  FieldBase local_1c8;
  undefined1 local_170 [224];
  FieldMap local_90 [120];
  
  FIXT11::Logout::Logout((Logout *)local_170);
  fillHeader((Header *)(local_170 + 0x70),"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)local_170,8,9,10);
  FIX::IntField::IntField((IntField *)&local_1c8,9,iVar1);
  local_1c8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327ea8;
  FIX::FieldMap::setField((FieldMap *)(local_170 + 0x70),&local_1c8,true);
  FIX::FieldBase::~FieldBase(&local_1c8);
  iVar1 = FIX::Message::checkSum((Message *)local_170,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_1c8,10,iVar1);
  local_1c8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00328060;
  FIX::FieldMap::setField(local_90,&local_1c8,true);
  FIX::FieldBase::~FieldBase(&local_1c8);
  FIX::Message::Message((Message *)__return_storage_ptr__,(Message *)local_170);
  *(undefined ***)&__return_storage_ptr__->super_Message = &PTR__Message_0032a3e0;
  FIX::Message::~Message((Message *)local_170);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Logout createT11Logout(const char *sender, const char *target, int seq) {
  FIXT11::Logout logout;
  fillHeader(logout.getHeader(), sender, target, seq);
  logout.getHeader().setField(BodyLength(logout.bodyLength()));
  logout.getTrailer().setField(CheckSum(logout.checkSum()));
  return logout;
}